

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O0

void helper_check_hcr_el2_trap_arm(CPUARMState *env,uint32_t rt,uint32_t reg)

{
  uint64_t uVar1;
  ulong uVar2;
  uint32_t syndrome;
  uint32_t reg_local;
  uint32_t rt_local;
  CPUARMState *env_local;
  
  if (reg == 0) {
    uVar1 = arm_hcr_el2_eff_arm(env);
    uVar2 = uVar1 & 0x8000;
  }
  else {
    if (1 < reg - 5 && reg != 7) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/vfp_helper.c"
                 ,0x54a,(char *)0x0);
    }
    uVar1 = arm_hcr_el2_eff_arm(env);
    uVar2 = uVar1 & 0x40000;
  }
  if (uVar2 == 0) {
    return;
  }
  raise_exception_arm(env,0xc,reg << 10 | 0x23e1c000 | rt << 5 | 1,2);
}

Assistant:

void HELPER(check_hcr_el2_trap)(CPUARMState *env, uint32_t rt, uint32_t reg)
{
    uint32_t syndrome;

    switch (reg) {
    case ARM_VFP_MVFR0:
    case ARM_VFP_MVFR1:
    case ARM_VFP_MVFR2:
        if (!(arm_hcr_el2_eff(env) & HCR_TID3)) {
            return;
        }
        break;
    case ARM_VFP_FPSID:
        if (!(arm_hcr_el2_eff(env) & HCR_TID0)) {
            return;
        }
        break;
    default:
        g_assert_not_reached();
        break;
    }

    syndrome = ((EC_FPIDTRAP << ARM_EL_EC_SHIFT)
                | ARM_EL_IL
                | (1 << 24) | (0xe << 20) | (7 << 14)
                | (reg << 10) | (rt << 5) | 1);

    raise_exception(env, EXCP_HYP_TRAP, syndrome, 2);
}